

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBufferParameters.cpp
# Opt level: O0

void __thiscall glcts::TextureBufferParameters::initTest(TextureBufferParameters *this)

{
  int iVar1;
  deUint32 dVar2;
  NotSupportedError *this_00;
  mapped_type *pmVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  Functions *gl;
  key_type_conflict local_90 [32];
  TextureBufferParameters *local_10;
  TextureBufferParameters *this_local;
  long lVar5;
  
  local_10 = this;
  if (((this->super_TestCaseBase).m_is_texture_buffer_supported & 1U) == 0) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"Texture buffer functionality not supported, skipping","",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferParameters.cpp"
               ,0x3d);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  local_90[0x1c] = 0x8229;
  pmVar3 = std::
           map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
           ::operator[](&this->m_internal_formats,local_90 + 0x1c);
  *pmVar3 = 1;
  local_90[0x1b] = 0x822d;
  pmVar3 = std::
           map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
           ::operator[](&this->m_internal_formats,local_90 + 0x1b);
  *pmVar3 = 2;
  local_90[0x1a] = 0x822e;
  pmVar3 = std::
           map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
           ::operator[](&this->m_internal_formats,local_90 + 0x1a);
  *pmVar3 = 4;
  local_90[0x19] = 0x8231;
  pmVar3 = std::
           map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
           ::operator[](&this->m_internal_formats,local_90 + 0x19);
  *pmVar3 = 1;
  local_90[0x18] = 0x8233;
  pmVar3 = std::
           map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
           ::operator[](&this->m_internal_formats,local_90 + 0x18);
  *pmVar3 = 2;
  local_90[0x17] = 0x8235;
  pmVar3 = std::
           map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
           ::operator[](&this->m_internal_formats,local_90 + 0x17);
  *pmVar3 = 4;
  local_90[0x16] = 0x8232;
  pmVar3 = std::
           map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
           ::operator[](&this->m_internal_formats,local_90 + 0x16);
  *pmVar3 = 1;
  local_90[0x15] = 0x8234;
  pmVar3 = std::
           map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
           ::operator[](&this->m_internal_formats,local_90 + 0x15);
  *pmVar3 = 2;
  local_90[0x14] = 0x8236;
  pmVar3 = std::
           map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
           ::operator[](&this->m_internal_formats,local_90 + 0x14);
  *pmVar3 = 4;
  local_90[0x13] = 0x822b;
  pmVar3 = std::
           map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
           ::operator[](&this->m_internal_formats,local_90 + 0x13);
  *pmVar3 = 2;
  local_90[0x12] = 0x822f;
  pmVar3 = std::
           map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
           ::operator[](&this->m_internal_formats,local_90 + 0x12);
  *pmVar3 = 4;
  local_90[0x11] = 0x8230;
  pmVar3 = std::
           map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
           ::operator[](&this->m_internal_formats,local_90 + 0x11);
  *pmVar3 = 8;
  local_90[0x10] = 0x8237;
  pmVar3 = std::
           map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
           ::operator[](&this->m_internal_formats,local_90 + 0x10);
  *pmVar3 = 2;
  local_90[0xf] = 0x8239;
  pmVar3 = std::
           map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
           ::operator[](&this->m_internal_formats,local_90 + 0xf);
  *pmVar3 = 4;
  local_90[0xe] = 0x823b;
  pmVar3 = std::
           map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
           ::operator[](&this->m_internal_formats,local_90 + 0xe);
  *pmVar3 = 8;
  local_90[0xd] = 0x8238;
  pmVar3 = std::
           map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
           ::operator[](&this->m_internal_formats,local_90 + 0xd);
  *pmVar3 = 2;
  local_90[0xc] = 0x823a;
  pmVar3 = std::
           map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
           ::operator[](&this->m_internal_formats,local_90 + 0xc);
  *pmVar3 = 4;
  local_90[0xb] = 0x823c;
  pmVar3 = std::
           map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
           ::operator[](&this->m_internal_formats,local_90 + 0xb);
  *pmVar3 = 8;
  local_90[10] = 0x8815;
  pmVar3 = std::
           map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
           ::operator[](&this->m_internal_formats,local_90 + 10);
  *pmVar3 = 0xc;
  local_90[9] = 0x8d83;
  pmVar3 = std::
           map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
           ::operator[](&this->m_internal_formats,local_90 + 9);
  *pmVar3 = 0xc;
  local_90[8] = 0x8d71;
  pmVar3 = std::
           map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
           ::operator[](&this->m_internal_formats,local_90 + 8);
  *pmVar3 = 0xc;
  local_90[7] = 0x8058;
  pmVar3 = std::
           map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
           ::operator[](&this->m_internal_formats,local_90 + 7);
  *pmVar3 = 4;
  local_90[6] = 0x881a;
  pmVar3 = std::
           map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
           ::operator[](&this->m_internal_formats,local_90 + 6);
  *pmVar3 = 8;
  local_90[5] = 0x8814;
  pmVar3 = std::
           map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
           ::operator[](&this->m_internal_formats,local_90 + 5);
  *pmVar3 = 0x10;
  local_90[4] = 0x8d8e;
  pmVar3 = std::
           map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
           ::operator[](&this->m_internal_formats,local_90 + 4);
  *pmVar3 = 4;
  local_90[3] = 0x8d88;
  pmVar3 = std::
           map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
           ::operator[](&this->m_internal_formats,local_90 + 3);
  *pmVar3 = 8;
  local_90[2] = 0x8d82;
  pmVar3 = std::
           map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
           ::operator[](&this->m_internal_formats,local_90 + 2);
  *pmVar3 = 0x10;
  local_90[1] = 0x8d7c;
  pmVar3 = std::
           map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
           ::operator[](&this->m_internal_formats,local_90 + 1);
  *pmVar3 = 4;
  local_90[0] = 0x8d76;
  pmVar3 = std::
           map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
           ::operator[](&this->m_internal_formats,local_90);
  *pmVar3 = 8;
  gl._4_4_ = 0x8d70;
  pmVar3 = std::
           map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
           ::operator[](&this->m_internal_formats,(key_type_conflict *)((long)&gl + 4));
  *pmVar3 = 0x10;
  pRVar4 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar1 = (*pRVar4->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar5 + 0x6f8))(1,&this->m_to_id);
  dVar2 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar2,"Could not generate texture object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferParameters.cpp"
                  ,99);
  (**(code **)(lVar5 + 0xb8))((this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER,this->m_to_id)
  ;
  dVar2 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar2,"Could not bind texture object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferParameters.cpp"
                  ,0x66);
  (**(code **)(lVar5 + 0x6c8))(1,&this->m_tbo_id);
  dVar2 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar2,"Could not generate buffer object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferParameters.cpp"
                  ,0x69);
  (**(code **)(lVar5 + 0x40))
            ((this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER,this->m_tbo_id);
  dVar2 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar2,"Could not bind buffer object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferParameters.cpp"
                  ,0x6c);
  return;
}

Assistant:

void TextureBufferParameters::initTest(void)
{
	/* Skip if required extensions are not supported. */
	if (!m_is_texture_buffer_supported)
	{
		throw tcu::NotSupportedError(TEXTURE_BUFFER_EXTENSION_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	m_internal_formats[GL_R8]		= sizeof(glw::GLubyte) * 1 /* components */;
	m_internal_formats[GL_R16F]		= sizeof(glw::GLhalf) * 1 /* components */;
	m_internal_formats[GL_R32F]		= sizeof(glw::GLfloat) * 1 /* components */;
	m_internal_formats[GL_R8I]		= sizeof(glw::GLbyte) * 1 /* components */;
	m_internal_formats[GL_R16I]		= sizeof(glw::GLshort) * 1 /* components */;
	m_internal_formats[GL_R32I]		= sizeof(glw::GLint) * 1 /* components */;
	m_internal_formats[GL_R8UI]		= sizeof(glw::GLubyte) * 1 /* components */;
	m_internal_formats[GL_R16UI]	= sizeof(glw::GLushort) * 1 /* components */;
	m_internal_formats[GL_R32UI]	= sizeof(glw::GLuint) * 1 /* components */;
	m_internal_formats[GL_RG8]		= sizeof(glw::GLubyte) * 2 /* components */;
	m_internal_formats[GL_RG16F]	= sizeof(glw::GLhalf) * 2 /* components */;
	m_internal_formats[GL_RG32F]	= sizeof(glw::GLfloat) * 2 /* components */;
	m_internal_formats[GL_RG8I]		= sizeof(glw::GLbyte) * 2 /* components */;
	m_internal_formats[GL_RG16I]	= sizeof(glw::GLshort) * 2 /* components */;
	m_internal_formats[GL_RG32I]	= sizeof(glw::GLint) * 2 /* components */;
	m_internal_formats[GL_RG8UI]	= sizeof(glw::GLubyte) * 2 /* components */;
	m_internal_formats[GL_RG16UI]   = sizeof(glw::GLushort) * 2 /* components */;
	m_internal_formats[GL_RG32UI]   = sizeof(glw::GLuint) * 2 /* components */;
	m_internal_formats[GL_RGB32F]   = sizeof(glw::GLfloat) * 3 /* components */;
	m_internal_formats[GL_RGB32I]   = sizeof(glw::GLint) * 3 /* components */;
	m_internal_formats[GL_RGB32UI]  = sizeof(glw::GLuint) * 3 /* components */;
	m_internal_formats[GL_RGBA8]	= sizeof(glw::GLubyte) * 4 /* components */;
	m_internal_formats[GL_RGBA16F]  = sizeof(glw::GLhalf) * 4 /* components */;
	m_internal_formats[GL_RGBA32F]  = sizeof(glw::GLfloat) * 4 /* components */;
	m_internal_formats[GL_RGBA8I]   = sizeof(glw::GLbyte) * 4 /* components */;
	m_internal_formats[GL_RGBA16I]  = sizeof(glw::GLshort) * 4 /* components */;
	m_internal_formats[GL_RGBA32I]  = sizeof(glw::GLint) * 4 /* components */;
	m_internal_formats[GL_RGBA8UI]  = sizeof(glw::GLubyte) * 4 /* components */;
	m_internal_formats[GL_RGBA16UI] = sizeof(glw::GLushort) * 4 /* components */;
	m_internal_formats[GL_RGBA32UI] = sizeof(glw::GLuint) * 4 /* components */;

	/* Retrieve GLES entry points. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	gl.genTextures(1, &m_to_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not generate texture object!");

	gl.bindTexture(m_glExtTokens.TEXTURE_BUFFER, m_to_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not bind texture object!");

	gl.genBuffers(1, &m_tbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not generate buffer object!");

	gl.bindBuffer(m_glExtTokens.TEXTURE_BUFFER, m_tbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not bind buffer object!");
}